

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcTendon::~IfcTendon(IfcTendon *this)

{
  ~IfcTendon((IfcTendon *)
             ((long)&this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.
                     super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject.
                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL> + 0x10));
  return;
}

Assistant:

IfcTendon() : Object("IfcTendon") {}